

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

FilterPropagateResult
duckdb::CheckZonemapTemplated<float>
          (BaseStatistics *stats,ExpressionType comparison_type,float min_value,float max_value,
          float constant)

{
  bool bVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  float *right;
  float *left;
  float local_58;
  float fVar2;
  string local_40;
  
  right = &local_58;
  left = &local_58;
  local_58 = constant;
  switch((int)CONCAT71(in_register_00000031,comparison_type)) {
  case 0x19:
  case 0x28:
    fVar2 = min_value;
    bVar1 = ConstantExactRange<float>(min_value,min_value,max_value);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = ConstantValueInRange<float>(fVar2,min_value,max_value);
    break;
  case 0x1a:
  case 0x25:
    fVar2 = min_value;
    bVar1 = ConstantValueInRange<float>(min_value,min_value,max_value);
    if (!bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = ConstantExactRange<float>(fVar2,min_value,max_value);
    goto LAB_005f99b4;
  case 0x1b:
    bVar1 = GreaterThan::Operation<float>(&local_58,(float *)&stack0xffffffffffffffac);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    right = (float *)&stack0xffffffffffffffb0;
    goto LAB_005f9989;
  case 0x1c:
    bVar1 = GreaterThan::Operation<float>((float *)&stack0xffffffffffffffb0,&local_58);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    left = (float *)&stack0xffffffffffffffac;
LAB_005f9989:
    bVar1 = GreaterThan::Operation<float>(left,right);
    break;
  case 0x1d:
    bVar1 = GreaterThan::Operation<float>((float *)&stack0xffffffffffffffac,&local_58);
    if (!bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = GreaterThan::Operation<float>((float *)&stack0xffffffffffffffb0,&local_58);
    goto LAB_005f99b4;
  case 0x1e:
    bVar1 = GreaterThanEquals::Operation<float>((float *)&stack0xffffffffffffffb0,&local_58);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = GreaterThanEquals::Operation<float>((float *)&stack0xffffffffffffffac,&local_58);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Expression type in zonemap check not implemented","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = (bool)(bVar1 ^ 1);
LAB_005f99b4:
  return bVar1 * '\x02';
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type, T min_value,
                                            T max_value, T constant) {
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		if (ConstantExactRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		if (ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_DISTINCT_FROM:
		if (!ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (ConstantExactRange(min_value, max_value, constant)) {
			// corner case of a cluster with one numeric equal to the target constant
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// GreaterThanEquals::Operation(X, C)
		// this can be true only if max(X) >= C
		// if min(X) >= C, then this is always true
		if (GreaterThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_GREATERTHAN:
		// GreaterThan::Operation(X, C)
		// this can be true only if max(X) > C
		// if min(X) > C, then this is always true
		if (GreaterThan::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThan::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// LessThanEquals::Operation(X, C)
		// this can be true only if min(X) <= C
		// if max(X) <= C, then this is always true
		if (LessThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHAN:
		// LessThan::Operation(X, C)
		// this can be true only if min(X) < C
		// if max(X) < C, then this is always true
		if (LessThan::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThan::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	default:
		throw InternalException("Expression type in zonemap check not implemented");
	}
}